

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurtainWallType::IfcCurtainWallType(IfcCurtainWallType *this)

{
  IfcCurtainWallType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcCurtainWallType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00fbe6b0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>,
             &PTR_construction_vtable_24__00fbe7e8);
  *(undefined8 *)this = 0xfbe580;
  *(undefined8 *)&this->field_0x1c0 = 0xfbe698;
  *(undefined8 *)&this->field_0x88 = 0xfbe5a8;
  *(undefined8 *)&this->field_0x98 = 0xfbe5d0;
  *(undefined8 *)&this->field_0xf0 = 0xfbe5f8;
  *(undefined8 *)&this->field_0x148 = 0xfbe620;
  *(undefined8 *)&this->field_0x180 = 0xfbe648;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xfbe670;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcCurtainWallType() : Object("IfcCurtainWallType") {}